

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

DielectricMaterial *
pbrt::DielectricMaterial::Create
          (TextureParameterDictionary *parameters,Image *normalMap,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  uintptr_t iptr;
  undefined4 extraout_var;
  DielectricMaterial *pDVar3;
  bool remapRoughness;
  string local_90;
  allocator<char> local_69;
  FloatTextureHandle displacement;
  SpectrumTextureHandle tint;
  FloatTextureHandle vRoughness;
  FloatTextureHandle uRoughness;
  SpectrumTextureHandle etaS;
  FloatTextureHandle etaF;
  Image *normalMap_local;
  Allocator alloc_local;
  
  normalMap_local = normalMap;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"eta",(allocator<char> *)&etaS);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&etaF,(string *)parameters,(memory_resource *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"eta",(allocator<char> *)&uRoughness);
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)&etaS,(string *)parameters,(SpectrumType)&local_90,
             (Allocator)0x1);
  std::__cxx11::string::~string((string *)&local_90);
  if ((((ulong)etaF.
               super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
               .bits & 0xffffffffffff) == 0) ||
     (((ulong)etaS.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits & 0xffffffffffff) == 0)) {
    if (((ulong)etaF.
                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                .bits & 0xffffffffffff) != 0) goto LAB_00387583;
  }
  else {
    Warning(loc,
            "Both \"float\" and \"spectrum\" variants of \"eta\" parameter were provided. Ignoring the \"float\" one."
           );
    etaF.
    super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
    .bits = (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             )0;
  }
  if (((ulong)etaS.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits & 0xffffffffffff) == 0) {
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar2) = 0x3fc00000;
    etaF.
    super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
    .bits = (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             )(CONCAT44(extraout_var,iVar2) | 0x5000000000000);
  }
LAB_00387583:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"uroughness",(allocator<char> *)&vRoughness);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&uRoughness,(string *)parameters,
             (memory_resource *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"vroughness",(allocator<char> *)&displacement);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&vRoughness,(string *)parameters,
             (memory_resource *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (((ulong)uRoughness.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits & 0xffffffffffff) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"roughness",(allocator<char> *)&tint);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&displacement,(string *)parameters,0.0,
               (memory_resource *)&local_90);
    uRoughness = displacement;
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (((ulong)vRoughness.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits & 0xffffffffffff) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"roughness",(allocator<char> *)&tint);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&displacement,(string *)parameters,0.0,
               (memory_resource *)&local_90);
    vRoughness = displacement;
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"displacement",(allocator<char> *)&tint);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&displacement,(string *)parameters,
             (memory_resource *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"remaproughness",(allocator<char> *)&tint);
  bVar1 = TextureParameterDictionary::GetOneBool(parameters,&local_90,true);
  std::__cxx11::string::~string((string *)&local_90);
  remapRoughness = bVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"tint",&local_69);
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)&tint,(string *)parameters,(SpectrumType)&local_90,
             (Allocator)0x0);
  std::__cxx11::string::~string((string *)&local_90);
  pDVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::DielectricMaterial,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::Image*&,pbrt::SpectrumTextureHandle&,bool&>
                     (&alloc_local,&uRoughness,&vRoughness,&etaF,&etaS,&displacement,
                      &normalMap_local,&tint,&remapRoughness);
  return pDVar3;
}

Assistant:

DielectricMaterial *DielectricMaterial::Create(
    const TextureParameterDictionary &parameters, Image *normalMap, const FileLoc *loc,
    Allocator alloc) {
    FloatTextureHandle etaF = parameters.GetFloatTextureOrNull("eta", alloc);
    SpectrumTextureHandle etaS =
        parameters.GetSpectrumTextureOrNull("eta", SpectrumType::Unbounded, alloc);
    if (etaF && etaS) {
        Warning(loc, "Both \"float\" and \"spectrum\" variants of \"eta\" parameter "
                     "were provided. Ignoring the \"float\" one.");
        etaF = nullptr;
    }
    if (!etaF && !etaS)
        etaF = alloc.new_object<FloatConstantTexture>(1.5);

    FloatTextureHandle uRoughness = parameters.GetFloatTextureOrNull("uroughness", alloc);
    FloatTextureHandle vRoughness = parameters.GetFloatTextureOrNull("vroughness", alloc);
    if (!uRoughness)
        uRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);
    if (!vRoughness)
        vRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);

    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);

    SpectrumTextureHandle tint =
        parameters.GetSpectrumTextureOrNull("tint", SpectrumType::Albedo, alloc);
    return alloc.new_object<DielectricMaterial>(uRoughness, vRoughness, etaF, etaS,
                                                displacement, normalMap, tint,
                                                remapRoughness);
}